

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::RobustBufferAccessBehavior::TexelFetchTest::iterate(TexelFetchTest *this)

{
  bool bVar1;
  string *psVar2;
  int iVar3;
  GLenum GVar4;
  uint uVar5;
  uint uVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestContext *pTVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *local_7d0;
  MessageBuilder local_7c8;
  GLenum local_648;
  GLenum local_644;
  GLenum error_1;
  GLenum error;
  MessageBuilder local_638;
  GLenum local_4b4;
  undefined1 local_4b0 [4];
  GLenum fbo_status;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  allocator<char> local_361;
  string local_360;
  undefined4 local_33c;
  char *local_338;
  MessageBuilder local_330;
  int local_1b0;
  int local_1ac;
  GLint max_image_samples;
  GLint max_integer_samples;
  string *local_188;
  string *fs_valid;
  string *local_160;
  string *fs_invalid;
  VertexArray vao;
  Program valid_program;
  Texture source_texture;
  Program invalid_program;
  undefined1 local_48 [8];
  Framebuffer framebuffer;
  Texture destination_texture;
  GLint local_20;
  GLenum texture_target;
  GLint level;
  bool case_result;
  bool test_result;
  Functions *gl;
  TexelFetchTest *this_local;
  Functions *gl_00;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar3);
  bVar1 = true;
  do {
    if (4 < (int)this->m_test_case) {
      if (bVar1) {
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,"Fail");
      }
      return STOP;
    }
    local_20 = 0;
    destination_texture.m_context._4_4_ = 0xde1;
    if ((this->m_test_case == R32UI_MULTISAMPLE) || (this->m_test_case == RG8_SNORM)) {
      this->m_test_case = this->m_test_case + RG8_SNORM;
    }
    else {
      RobustBufferAccessBehavior::Texture::Texture
                ((Texture *)&framebuffer.m_context,(this->super_TestCase).m_context);
      RobustBufferAccessBehavior::Framebuffer::Framebuffer
                ((Framebuffer *)local_48,(this->super_TestCase).m_context);
      RobustBufferAccessBehavior::Program::Program
                ((Program *)&source_texture.m_context,(this->super_TestCase).m_context);
      RobustBufferAccessBehavior::Texture::Texture
                ((Texture *)&valid_program.m_context,(this->super_TestCase).m_context);
      RobustBufferAccessBehavior::Program::Program
                ((Program *)&vao.m_context,(this->super_TestCase).m_context);
      VertexArray::VertexArray((VertexArray *)&fs_invalid,(this->super_TestCase).m_context);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&fs_valid,this,0);
      local_160 = (string *)&fs_valid;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                (&max_image_samples,this,1);
      local_188 = (string *)&max_image_samples;
      VertexArray::Generate(gl_00,(GLuint *)&fs_invalid);
      VertexArray::Bind(gl_00,(GLuint)fs_invalid);
      RobustBufferAccessBehavior::Texture::Generate(gl_00,(GLuint *)&framebuffer.m_context);
      RobustBufferAccessBehavior::Texture::Generate(gl_00,(GLuint *)&valid_program.m_context);
      if (this->m_test_case == R32UI_MULTISAMPLE) {
        (*gl_00->getIntegerv)(0x9110,&local_1ac);
        (*gl_00->getIntegerv)(0x906d,&local_1b0);
        if ((3 < local_1ac) && (3 < local_1b0)) goto LAB_016a0f22;
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<(&local_330,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [12])0x29c1d9f);
        iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
        local_338 = (char *)CONCAT44(extraout_var_00,iVar3);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_338);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [15])0x29abadb);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_330);
        local_33c = 4;
      }
      else {
LAB_016a0f22:
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,0,(ulong)(uint)framebuffer.m_context);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,1,(ulong)(uint)valid_program.m_context);
        if (this->m_test_case == R32UI_MIPMAP) {
          local_20 = 1;
        }
        else if (this->m_test_case == R32UI_MULTISAMPLE) {
          destination_texture.m_context._4_4_ = 0x9100;
        }
        RobustBufferAccessBehavior::Framebuffer::Generate(gl_00,(GLuint *)local_48);
        RobustBufferAccessBehavior::Framebuffer::Bind(gl_00,0x8ca9,local_48._0_4_);
        RobustBufferAccessBehavior::Framebuffer::AttachTexture
                  (gl_00,0x8ca9,0x8ce0,(uint)framebuffer.m_context,local_20,0x10,0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"",&local_361);
        psVar2 = local_188;
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_388);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"",&local_3a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"",&local_3d1);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_3f8);
        RobustBufferAccessBehavior::Program::Init
                  ((Program *)&vao.m_context,&local_360,psVar2,&local_388,&local_3a8,&local_3d0,
                   &local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::allocator<char>::~allocator(&local_3d1);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator(&local_3a9);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator(&local_361);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"",&local_419);
        psVar2 = local_160;
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_440);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"",&local_461);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_489);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(local_4b0);
        RobustBufferAccessBehavior::Program::Init
                  ((Program *)&source_texture.m_context,&local_418,psVar2,&local_440,&local_460,
                   &local_488,(string *)local_4b0);
        std::__cxx11::string::~string((string *)local_4b0);
        std::__cxx11::string::~string((string *)&local_488);
        std::allocator<char>::~allocator(&local_489);
        std::__cxx11::string::~string((string *)&local_460);
        std::allocator<char>::~allocator(&local_461);
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator(&local_419);
        RobustBufferAccessBehavior::Program::Use(gl_00,(GLuint)vao.m_context);
        (*gl_00->activeTexture)(0x84c0);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"ActiveTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x588);
        RobustBufferAccessBehavior::Texture::Bind
                  (gl_00,(uint)valid_program.m_context,destination_texture.m_context._4_4_);
        (*gl_00->uniform1i)(0,0);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"Uniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x58b);
        local_4b4 = (*gl_00->checkFramebufferStatus)(0x8ca9);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"CheckFramebufferStatus",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x58f);
        if (local_4b4 == 0x8cd5) {
          if (this->m_test_case == R32UI_MULTISAMPLE) {
            (*gl_00->enable)(0x809d);
            GVar4 = (*gl_00->getError)();
            glu::checkError(GVar4,"Enable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                            ,0x59c);
          }
          (*gl_00->drawArrays)(0,0,1);
          local_644 = (*gl_00->getError)();
          if (this->m_test_case == R32UI_MULTISAMPLE) {
            (*gl_00->disable)(0x809d);
            GVar4 = (*gl_00->getError)();
            glu::checkError(GVar4,"Disable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                            ,0x5a9);
          }
          glu::checkError(local_644,"DrawArrays",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5ad);
          uVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                            (this,(ulong)(uint)framebuffer.m_context);
          RobustBufferAccessBehavior::Program::Use(gl_00,(GLuint)source_texture.m_context);
          (*gl_00->activeTexture)(0x84c0);
          GVar4 = (*gl_00->getError)();
          glu::checkError(GVar4,"ActiveTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5bc);
          RobustBufferAccessBehavior::Texture::Bind
                    (gl_00,(uint)valid_program.m_context,destination_texture.m_context._4_4_);
          (*gl_00->uniform1i)(0,0);
          GVar4 = (*gl_00->getError)();
          glu::checkError(GVar4,"Uniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5bf);
          (*gl_00->drawArrays)(0,0,1);
          local_648 = (*gl_00->getError)();
          glu::checkError(local_648,"DrawArrays",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5c8);
          uVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])();
          if ((uVar6 & 1) == 0 || (uVar5 & 1) == 0) {
            pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar9 = tcu::TestContext::getLog(pTVar8);
            tcu::TestLog::operator<<(&local_7c8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar10 = tcu::MessageBuilder::operator<<(&local_7c8,(char (*) [12])0x29c1d9f);
            iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
            local_7d0 = (char *)CONCAT44(extraout_var_02,iVar3);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_7d0);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])0x2b1ddcc);
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_7c8);
            bVar1 = false;
          }
          local_33c = 0;
        }
        else {
          pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar9 = tcu::TestContext::getLog(pTVar8);
          tcu::TestLog::operator<<(&local_638,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<(&local_638,(char (*) [12])0x29c1d9f);
          iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
          _error_1 = (char *)CONCAT44(extraout_var_01,iVar3);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char **)&error_1);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [15])0x29abadb);
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_638);
          local_33c = 4;
        }
      }
      std::__cxx11::string::~string((string *)&max_image_samples);
      std::__cxx11::string::~string((string *)&fs_valid);
      VertexArray::~VertexArray((VertexArray *)&fs_invalid);
      RobustBufferAccessBehavior::Program::~Program((Program *)&vao.m_context);
      RobustBufferAccessBehavior::Texture::~Texture((Texture *)&valid_program.m_context);
      RobustBufferAccessBehavior::Program::~Program((Program *)&source_texture.m_context);
      RobustBufferAccessBehavior::Framebuffer::~Framebuffer((Framebuffer *)local_48);
      RobustBufferAccessBehavior::Texture::~Texture((Texture *)&framebuffer.m_context);
    }
    this->m_test_case = this->m_test_case + RG8_SNORM;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TexelFetchTest::iterate()
{
	/* Constants */
	static const GLuint height = 16;
	static const GLuint width  = 16;

	/* GL entry points */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	for (; m_test_case < LAST; m_test_case = (TEST_CASES)((GLuint)m_test_case + 1))
	{
		bool   case_result	= true;
		GLint  level		  = 0;
		GLenum texture_target = GL_TEXTURE_2D;

		if (R32UI_MULTISAMPLE == m_test_case || RG8_SNORM == m_test_case)
		{
			// 1. RG8_SNORM case:
			// Skip RG8_SNORM format case.
			// RG8_SNORM is not required to be used as a render target
			// OpenGL 4.5 Core Spec, Page 197
			//
			// 2. R32UI_MULTISAMPLE case
			// Skip test in multi sample case
			// texelFetch with invalid lod plane results undefined value
			// OpenGL 4.5 Core Spec, around page 377
			m_test_case = (TEST_CASES)((GLuint)m_test_case + 1);
			continue;
		}

		/* */
		Texture		destination_texture(m_context);
		Framebuffer framebuffer(m_context);
		Program		invalid_program(m_context);
		Texture		source_texture(m_context);
		Program		valid_program(m_context);
		VertexArray vao(m_context);

		const std::string& fs_invalid = getFragmentShader(false);
		const std::string& fs_valid   = getFragmentShader(true);

		/* Prepare VAO */
		VertexArray::Generate(gl, vao.m_id);
		VertexArray::Bind(gl, vao.m_id);

		/* Prepare textures */
		Texture::Generate(gl, destination_texture.m_id);
		Texture::Generate(gl, source_texture.m_id);

		if (R32UI_MULTISAMPLE == m_test_case)
		{
			GLint max_integer_samples;
			gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &max_integer_samples);
			GLint max_image_samples;
			gl.getIntegerv(GL_MAX_IMAGE_SAMPLES, &max_image_samples);
			if (max_integer_samples < 4 || max_image_samples < 4)
			{
				/* prepareTexture() hard-codes 4 samples (n_levels) for
				 * R32UI_MULTISAMPLE case. This value exceeds the required
				 * min-max value (1 in OpenGL ES 3.2) and is not supported
				 * by all implementations.
				 *
				 * Also, the test uses a compute shader with images
				 * to upload the texture so max_image_samples >= 4
				 * is also required.
				 */
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
													<< " not supported" << tcu::TestLog::EndMessage;

				continue;
			}
		}

		prepareTexture(false, destination_texture.m_id);
		prepareTexture(true, source_texture.m_id);

		/* Select FBO settings */
		if (R32UI_MIPMAP == m_test_case)
		{
			level = 1;
		}
		else if (R32UI_MULTISAMPLE == m_test_case)
		{
			texture_target = GL_TEXTURE_2D_MULTISAMPLE;
		}

		/* Prepare FBO */
		Framebuffer::Generate(gl, framebuffer.m_id);
		Framebuffer::Bind(gl, GL_DRAW_FRAMEBUFFER, framebuffer.m_id);
		Framebuffer::AttachTexture(gl, GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, destination_texture.m_id, level,
								   width, height);

		/* Prepare programs */
		valid_program.Init("" /* cs */, fs_valid, getGeometryShader(), "" /* tcs */, "" /* tes */, getVertexShader());
		invalid_program.Init("" /* cs */, fs_invalid, getGeometryShader(), "" /* tcs */, "" /* tes */,
							 getVertexShader());

		/* Test valid case */
		/* Set program */
		Program::Use(gl, valid_program.m_id);

		/* Set texture */
		gl.activeTexture(GL_TEXTURE0); /* location = 0 */
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");
		Texture::Bind(gl, source_texture.m_id, texture_target);
		gl.uniform1i(0 /* location */, 0 /* texture unit */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		/* Check if setup is supported */
		GLenum fbo_status = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CheckFramebufferStatus");
		if (GL_FRAMEBUFFER_COMPLETE != fbo_status)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
												<< " not supported" << tcu::TestLog::EndMessage;

			continue;
		}

		/* Enable multisampling */
		if (R32UI_MULTISAMPLE == m_test_case)
		{
			gl.enable(GL_MULTISAMPLE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");
		}

		/* Draw */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		{
			/* Get error from draw */
			GLenum error = gl.getError();

			/* Disable multisampling */
			if (R32UI_MULTISAMPLE == m_test_case)
			{
				gl.disable(GL_MULTISAMPLE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");
			}

			/* Handle error from draw */
			GLU_EXPECT_NO_ERROR(error, "DrawArrays");
		}

		/* Verification */
		if (false == verifyValidResults(destination_texture.m_id))
		{
			case_result = false;
		}

		/* Test invalid case */
		/* Set program */
		Program::Use(gl, invalid_program.m_id);

		/* Set texture */
		gl.activeTexture(GL_TEXTURE0); /* location = 0 */
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");
		Texture::Bind(gl, source_texture.m_id, texture_target);
		gl.uniform1i(0 /* location */, 0 /* texture unit */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		/* Draw */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		{
			/* Get error from draw */
			GLenum error = gl.getError();

			/* Handle error from draw */
			GLU_EXPECT_NO_ERROR(error, "DrawArrays");
		}

		/* Verification */
		if (false == verifyInvalidResults(destination_texture.m_id))
		{
			case_result = false;
		}

		/* Set test result */
		if (false == case_result)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
												<< " failed" << tcu::TestLog::EndMessage;

			test_result = false;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}